

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  string *psVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmCustomCommandLine singleLine;
  string configFile;
  GlobalTargetInfo gti;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_f0;
  undefined1 local_d0 [112];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  bool local_40;
  PerConfig local_3c;
  bool local_38;
  char *__s;
  
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x22])();
  __s = (char *)CONCAT44(extraout_var,iVar4);
  if (__s != (char *)0x0) {
    puVar2 = (this->Makefiles).
             super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmMakefile *)
                        (puVar2->_M_t).
                        super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
    local_d0._8_8_ = (psVar5->_M_dataplus)._M_p;
    local_d0._0_8_ = psVar5->_M_string_length;
    local_d0._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d0._24_8_ = 0x18;
    local_d0._32_8_ = "/CPackSourceConfig.cmake";
    local_d0._40_8_ = (char *)0x0;
    views._M_len = 2;
    views._M_array = (iterator)local_d0;
    cmCatViews(&local_f0,views);
    bVar3 = cmsys::SystemTools::FileExists(&local_f0);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_d0,"package_source",(allocator<char> *)&local_108);
      paVar1 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"when CPack source packaging is enabled","");
      bVar3 = CheckCMP0037(this,(string *)local_d0,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      }
      if (bVar3) {
        local_d0._0_8_ = local_d0 + 0x10;
        local_d0._8_8_ = (pointer)0x0;
        local_d0._16_8_ = local_d0._16_8_ & 0xffffffffffffff00;
        local_d0._40_8_ = (char *)0x0;
        local_d0[0x30] = '\0';
        local_d0._64_8_ = (pointer)0x0;
        local_d0._72_8_ = (pointer)0x0;
        local_d0._80_8_ = (pointer)0x0;
        local_d0._88_8_ = (pointer)0x0;
        local_d0._96_8_ = (pointer)0x0;
        local_d0._104_8_ = (pointer)0x0;
        local_58 = 0;
        local_50._M_local_buf[0] = '\0';
        local_40 = false;
        local_3c = Yes;
        local_38 = false;
        local_d0._32_8_ = local_d0 + 0x30;
        local_60._M_p = (pointer)&local_50;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)local_d0,0,(char *)0x0,(ulong)__s);
        std::__cxx11::string::_M_replace
                  ((ulong)(local_d0 + 0x20),0,(char *)local_d0._40_8_,0x7fb8ce);
        cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                  ((cmMakefile *)
                   (puVar2->_M_t).
                   super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t);
        std::__cxx11::string::_M_assign((string *)&local_60);
        local_40 = true;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_108,psVar5);
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"--config","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"./CPackSourceConfig.cmake","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_f0);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_d0 + 0x40),(cmCustomCommandLine *)&local_108);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,(GlobalTargetInfo *)local_d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_p != &local_50) {
          operator_delete(local_60._M_p,
                          CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0]) +
                          1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_d0 + 0x58));
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_d0 + 0x40));
        if ((undefined1 *)local_d0._32_8_ != local_d0 + 0x30) {
          operator_delete((void *)local_d0._32_8_,CONCAT71(local_d0._49_7_,local_d0[0x30]) + 1);
        }
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (!packageSourceTargetName) {
    return;
  }

  auto& mf = this->Makefiles[0];
  std::string configFile =
    cmStrCat(mf->GetCurrentBinaryDirectory(), "/CPackSourceConfig.cmake");
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package_source" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target,
                            "when CPack source packaging is enabled")) {
      return;
    }
  }

  GlobalTargetInfo gti;
  gti.Name = packageSourceTargetName;
  gti.Message = "Run CPack packaging tool for source...";
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  singleLine.push_back("--config");
  singleLine.push_back("./CPackSourceConfig.cmake");
  singleLine.push_back(std::move(configFile));
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}